

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::Constraint_const*>::emplace_back<slang::ast::Constraint_const*>
          (SmallVectorBase<slang::ast::Constraint_const*> *this,Constraint **args)

{
  long lVar1;
  ulong uVar2;
  SmallVectorBase<slang::ast::Constraint_const*> *__src;
  void *__dest;
  reference ppCVar3;
  SmallVectorBase<slang::ast::Constraint_const*> *__src_00;
  ulong uVar4;
  
  lVar1 = *(long *)(this + 8);
  __src_00 = (SmallVectorBase<slang::ast::Constraint_const*> *)(lVar1 * 8 + *(long *)this);
  if (lVar1 != *(long *)(this + 0x10)) {
    *(Constraint **)__src_00 = *args;
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(*(long *)this + lVar1 * 8);
  }
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar1 = *(long *)this;
    __dest = operator_new(uVar4 * 8);
    ppCVar3 = (reference)((long)__dest + ((long)__src_00 - lVar1));
    *(Constraint **)((long)__dest + ((long)__src_00 - lVar1)) = *args;
    __src = *(SmallVectorBase<slang::ast::Constraint_const*> **)this;
    lVar1 = *(long *)(this + 8);
    if (__src + (lVar1 * 8 - (long)__src_00) ==
        (SmallVectorBase<slang::ast::Constraint_const*> *)0x0) {
      if (lVar1 != 0) {
        memmove(__dest,__src,lVar1 << 3);
      }
    }
    else {
      if (__src != __src_00) {
        memmove(__dest,__src,(long)__src_00 - (long)__src);
      }
      memcpy(ppCVar3 + 1,__src_00,(size_t)(__src + (lVar1 * 8 - (long)__src_00)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return ppCVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }